

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O0

value attribute_metadata_name(attribute_conflict attr)

{
  value *ppvVar1;
  value pvVar2;
  long in_RDI;
  value name;
  value *name_array;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  size_t length;
  value *in_stack_ffffffffffffffe0;
  char *local_8;
  
  local_8 = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x107fac);
    pvVar2 = value_create_string(local_8,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (char *)0x0;
    }
    else {
      length = *(size_t *)(in_RDI + 8);
      strlen(*(char **)(in_RDI + 8));
      pvVar2 = value_create_string(local_8,length);
      ppvVar1[1] = pvVar2;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value attribute_metadata_name(attribute attr)
{
	static const char name_str[] = "name";
	value *name_array, name = value_create_array(NULL, 2);

	if (name == NULL)
	{
		return NULL;
	}

	name_array = value_to_array(name);
	name_array[0] = value_create_string(name_str, sizeof(name_str) - 1);

	if (name_array[0] == NULL)
	{
		value_type_destroy(name);
		return NULL;
	}

	name_array[1] = value_create_string(attr->name, strlen(attr->name));

	if (name_array[1] == NULL)
	{
		value_type_destroy(name);
		return NULL;
	}

	return name;
}